

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_0::anon_unknown_5::createIndexData
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,TestConfig *config)

{
  unsigned_short *__args;
  iterator iVar1;
  uint uVar2;
  unsigned_short local_3c [6];
  
  if (0 < config->triangleCount) {
    uVar2 = 0;
    do {
      if ((uVar2 & 1) == 0) {
        local_3c[5] = 0;
        iVar1._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar1,local_3c + 5);
        }
        else {
          *iVar1._M_current = 0;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_3c[4] = 1;
        iVar1._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar1,local_3c + 4);
        }
        else {
          *iVar1._M_current = 1;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_3c[3] = 2;
        iVar1._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          __args = local_3c + 3;
          goto LAB_001fa3fe;
        }
        *iVar1._M_current = 2;
LAB_001fa3e4:
        (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      else {
        local_3c[2] = 2;
        iVar1._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar1,local_3c + 2);
        }
        else {
          *iVar1._M_current = 2;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_3c[1] = 3;
        iVar1._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar1,local_3c + 1);
        }
        else {
          *iVar1._M_current = 3;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_3c[0] = 0;
        iVar1._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        __args = local_3c;
        if (iVar1._M_current !=
            (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar1._M_current = 0;
          goto LAB_001fa3e4;
        }
LAB_001fa3fe:
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>(data,iVar1,__args);
      }
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < config->triangleCount);
  }
  return;
}

Assistant:

void createIndexData (vector<deUint16>& data, const TestConfig& config)
{
	for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
	{
		if ((triangleNdx % 2) == 0)
		{
			data.push_back(0);
			data.push_back(1);
			data.push_back(2);
		}
		else
		{
			data.push_back(2);
			data.push_back(3);
			data.push_back(0);
		}
	}
}